

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O0

bool __thiscall Rml::BaseXMLParser::ReadCDATA(BaseXMLParser *this,char *tag_terminator)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  String local_f8;
  String local_d8;
  String local_b8;
  undefined1 local_98 [8];
  String tag_name;
  size_t slash_pos;
  String tag;
  undefined1 local_40 [8];
  String cdata;
  char *tag_terminator_local;
  BaseXMLParser *this_local;
  
  cdata.field_2._8_8_ = tag_terminator;
  ::std::__cxx11::string::string((string *)local_40);
  if (cdata.field_2._8_8_ == 0) {
    FindString(this,"]]>",(String *)local_40,false);
    ::std::__cxx11::string::operator+=((string *)&this->data,(string *)local_40);
    this_local._7_1_ = 1;
    tag.field_2._8_4_ = 1;
  }
  else {
    do {
      while( true ) {
        bVar1 = FindString(this,"<",(String *)local_40,false);
        if (!bVar1) {
          this_local._7_1_ = 0;
          tag.field_2._8_4_ = 1;
          goto LAB_004bab3c;
        }
        bVar1 = PeekString(this,"/",false);
        if (bVar1) break;
        ::std::__cxx11::string::operator+=((string *)local_40,"<");
      }
      ::std::__cxx11::string::string((string *)&slash_pos);
      bVar1 = FindString(this,">",(String *)&slash_pos,false);
      if (bVar1) {
        tag_name.field_2._8_8_ = ::std::__cxx11::string::find((char)&slash_pos,0x2f);
        if (tag_name.field_2._8_8_ == -1) {
          ::std::__cxx11::string::string((string *)&local_b8,(string *)&slash_pos);
        }
        else {
          ::std::__cxx11::string::substr((ulong)&local_b8,(ulong)&slash_pos);
        }
        StringUtilities::StripWhitespace((String *)local_98,&local_b8);
        ::std::__cxx11::string::~string((string *)&local_b8);
        ::std::__cxx11::string::string((string *)&local_f8,(string *)local_98);
        StringUtilities::ToLower(&local_d8,&local_f8);
        bVar1 = ::std::operator==(&local_d8,(char *)cdata.field_2._8_8_);
        ::std::__cxx11::string::~string((string *)&local_d8);
        ::std::__cxx11::string::~string((string *)&local_f8);
        if (bVar1) {
          ::std::__cxx11::string::operator+=((string *)&this->data,(string *)local_40);
          this_local._7_1_ = 1;
        }
        else {
          ::std::operator+(&local_138,'<',
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &slash_pos);
          ::std::operator+(&local_118,&local_138,'>');
          ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_118);
          ::std::__cxx11::string::~string((string *)&local_118);
          ::std::__cxx11::string::~string((string *)&local_138);
        }
        tag.field_2._9_3_ = 0;
        tag.field_2._M_local_buf[8] = bVar1;
        ::std::__cxx11::string::~string((string *)local_98);
        if (tag.field_2._8_4_ == 0) goto LAB_004baafd;
      }
      else {
        ::std::__cxx11::string::operator+=((string *)local_40,"<");
LAB_004baafd:
        tag.field_2._8_4_ = 0;
      }
      ::std::__cxx11::string::~string((string *)&slash_pos);
    } while (tag.field_2._8_4_ == 0);
  }
LAB_004bab3c:
  ::std::__cxx11::string::~string((string *)local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool BaseXMLParser::ReadCDATA(const char* tag_terminator)
{
	String cdata;
	if (tag_terminator == nullptr)
	{
		FindString("]]>", cdata);
		data += cdata;
		return true;
	}
	else
	{
		for (;;)
		{
			// Search for the next tag opening.
			if (!FindString("<", cdata))
				return false;

			if (PeekString("/", false))
			{
				String tag;
				if (FindString(">", tag))
				{
					size_t slash_pos = tag.find('/');
					String tag_name = StringUtilities::StripWhitespace(slash_pos == String::npos ? tag : tag.substr(slash_pos + 1));
					if (StringUtilities::ToLower(std::move(tag_name)) == tag_terminator)
					{
						data += cdata;
						return true;
					}
					else
					{
						cdata += '<' + tag + '>';
					}
				}
				else
					cdata += "<";
			}
			else
				cdata += "<";
		}
	}
}